

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ArrayMapMethod::checkArguments
          (ArrayMapMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  LanguageVersion LVar1;
  Compilation *pCVar2;
  bool bVar3;
  Diagnostic *pDVar4;
  Type *pTVar5;
  char *pcVar6;
  string_view arg;
  
  pCVar2 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar3) {
    if (iterExpr != (Expression *)0x0) {
      LVar1 = (pCVar2->options).languageVersion;
      if ((int)LVar1 < 1) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x20001,range);
        pcVar6 = "";
        if (LVar1 == Default) {
          pcVar6 = "1800-2017";
        }
        arg._M_str = pcVar6;
        arg._M_len = (ulong)(LVar1 == Default) * 9;
        Diagnostic::operator<<(pDVar4,arg);
      }
      pTVar5 = Type::getCanonicalType(((*args->_M_ptr)->type).ptr);
      pTVar5 = (Type *)(*(code *)(&DAT_00445f70 +
                                 *(int *)(&DAT_00445f70 +
                                         (ulong)((pTVar5->super_Symbol).kind -
                                                FixedSizeUnpackedArrayType) * 4)))();
      return pTVar5;
    }
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0xb,range);
    Diagnostic::operator<<(pDVar4,&(this->super_SystemSubroutine).name);
    pTVar5 = pCVar2->errorType;
  }
  else {
    pTVar5 = pCVar2->errorType;
  }
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!iterExpr) {
            context.addDiag(diag::ArrayLocatorWithClause, range) << name;
            return comp.getErrorType();
        }

        auto languageVersion = comp.languageVersion();
        if (languageVersion < LanguageVersion::v1800_2023)
            context.addDiag(diag::WrongLanguageVersion, range) << toString(languageVersion);

        auto& arrayType = args[0]->type->getCanonicalType();
        auto& elemType = *iterExpr->type;
        switch (arrayType.kind) {
            case SymbolKind::FixedSizeUnpackedArrayType: {
                auto& fsuat = arrayType.as<FixedSizeUnpackedArrayType>();
                return FixedSizeUnpackedArrayType::fromDim(*context.scope, elemType, fsuat.range,
                                                           iterExpr->sourceRange);
            }
            case SymbolKind::DynamicArrayType:
                return *comp.emplace<DynamicArrayType>(elemType);
            case SymbolKind::AssociativeArrayType: {
                auto& aat = arrayType.as<AssociativeArrayType>();
                return *comp.emplace<AssociativeArrayType>(elemType, aat.indexType);
            }
            case SymbolKind::QueueType: {
                auto& qt = arrayType.as<QueueType>();
                return *comp.emplace<QueueType>(elemType, qt.maxBound);
            }
            default:
                SLANG_UNREACHABLE;
        }
    }